

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
host_array_copy_construct_Test::host_array_copy_construct_Test(host_array_copy_construct_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014ac50;
  return;
}

Assistant:

CAMP_TEST_BEGIN(array, copy_assignment)
{
   camp::array<int, 3> a{1, 2, 10};
   camp::array<int, 3> b{3, 4, 6};
   a = b;
   b[1] = 1;

   return a[0] == 3 &&
          a[1] == 4 &&
          a[2] == 6;
}